

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O0

void __thiscall
embree::CoronaLoader::loadMaterialDefinition(CoronaLoader *this,Ref<embree::XML> *xml)

{
  bool bVar1;
  size_type sVar2;
  runtime_error *prVar3;
  mapped_type *pmVar4;
  long *in_RSI;
  string name;
  Ref<embree::XML> *in_stack_00000310;
  CoronaLoader *in_stack_00000318;
  char *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  key_type *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  XML *in_stack_fffffffffffffe78;
  long *local_170;
  allocator local_161;
  string local_160 [32];
  string local_140 [24];
  ParseLocation *in_stack_fffffffffffffed8;
  string local_f8 [35];
  undefined1 local_d5;
  string local_88 [32];
  long *local_68;
  long *local_58;
  long *local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  long *local_30;
  long **local_20;
  mapped_type *local_18;
  long **local_10;
  
  local_68 = in_RSI;
  bVar1 = std::operator!=(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  if (bVar1) {
    local_d5 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_30 = local_68;
    ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffed8);
    std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
    local_38 = local_68;
    std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
    std::runtime_error::runtime_error(prVar3,local_88);
    local_d5 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_40 = local_68;
  sVar2 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::size
                    ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *
                     )(*local_68 + 0x80));
  if (sVar2 != 1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_48 = local_68;
    ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffed8);
    std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
    std::runtime_error::runtime_error(prVar3,local_f8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_50 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"name",&local_161);
  XML::parm(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  local_58 = local_68;
  std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
            ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
             (*local_68 + 0x80),0);
  loadMaterial(in_stack_00000318,in_stack_00000310);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                         *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  local_20 = &local_170;
  local_18 = pmVar4;
  if (pmVar4->ptr != (MaterialNode *)0x0) {
    (*(pmVar4->ptr->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  pmVar4->ptr = (MaterialNode *)*local_20;
  *local_20 = (long *)0x0;
  local_10 = &local_170;
  if (local_170 != (long *)0x0) {
    (**(code **)(*local_170 + 0x18))();
  }
  std::__cxx11::string::~string(local_140);
  return;
}

Assistant:

void CoronaLoader::loadMaterialDefinition(const Ref<XML>& xml) 
  {
    if (xml->name != "materialDefinition") 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid material definition: "+xml->name);
    if (xml->children.size() != 1) 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid material definition");

    const std::string name = xml->parm("name");
    materialMap[name] = loadMaterial(xml->children[0]);
  }